

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Parser::SkipRestOfBlock(Parser *this)

{
  bool bVar1;
  string_view local_38;
  string_view local_28;
  long local_18;
  size_t block_count;
  Parser *this_local;
  
  local_18 = 1;
  block_count = (size_t)this;
  do {
    bVar1 = AtEnd(this);
    if (bVar1) {
      return;
    }
    bVar1 = LookingAtType(this,TYPE_SYMBOL);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"}");
      bVar1 = TryConsumeEndOfDeclaration(this,local_28,(LocationRecorder *)0x0);
      if (bVar1) {
        local_18 = local_18 + -1;
        if (local_18 == 0) {
          return;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"{");
        bVar1 = TryConsume(this,local_38);
        if (bVar1) {
          local_18 = local_18 + 1;
        }
      }
    }
    io::Tokenizer::Next(this->input_);
  } while( true );
}

Assistant:

void Parser::SkipRestOfBlock() {
  size_t block_count = 1;
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration("}", nullptr)) {
        if (--block_count == 0) break;
      } else if (TryConsume("{")) {
        ++block_count;
      }
    }
    input_->Next();
  }
}